

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void trimFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  sqlite3_value *pVal;
  void *pvVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte bVar8;
  ulong uVar9;
  uchar *puVar10;
  ulong uVar11;
  uchar **local_60;
  char *local_50;
  
  pVal = *argv;
  uVar5._0_2_ = pVal->flags;
  uVar5._2_1_ = pVal->enc;
  uVar5._3_1_ = pVal->eSubtype;
  if ((0xaaaaaaaaU >> (uVar5 & 0x1f) & 1) != 0) {
    return;
  }
  uVar9 = 1;
  local_50 = (char *)sqlite3ValueText(pVal,'\x01');
  if (local_50 == (char *)0x0) {
    return;
  }
  iVar3 = sqlite3ValueBytes(*argv,'\x01');
  if (argc == 1) {
    puVar10 = "\x01";
    local_60 = trimFunc::azOne;
  }
  else {
    pbVar6 = (byte *)sqlite3ValueText(argv[1],'\x01');
    if (pbVar6 == (byte *)0x0) {
      return;
    }
    bVar8 = *pbVar6;
    if (bVar8 == 0) goto LAB_00195c3d;
    uVar5 = 0;
    pbVar7 = pbVar6;
    do {
      if (bVar8 < 0xc0) {
        bVar8 = pbVar7[1];
      }
      else {
        bVar8 = pbVar7[1];
      }
      pbVar7 = pbVar7 + 1;
      uVar5 = uVar5 + 1;
    } while (bVar8 != 0);
    local_60 = (uchar **)contextMalloc(context,(ulong)uVar5 * 9);
    if (local_60 == (uchar **)0x0) {
      return;
    }
    if (*pbVar6 == 0) goto LAB_00195c3d;
    puVar10 = (uchar *)(local_60 + uVar5);
    uVar9 = 0;
    do {
      local_60[uVar9] = pbVar6;
      pbVar7 = pbVar6 + 1;
      *(char *)((long)puVar10 + uVar9) = (char)pbVar7 - (char)pbVar6;
      uVar9 = uVar9 + 1;
      pbVar6 = pbVar7;
    } while (*pbVar7 != 0);
  }
  pvVar1 = context->pFunc->pUserData;
  if ((0 < iVar3 & (byte)pvVar1) == 1) {
LAB_00195a8c:
    uVar11 = 0;
    do {
      bVar8 = *(byte *)((long)puVar10 + uVar11);
      if ((int)(uint)bVar8 <= iVar3) {
        iVar4 = bcmp(local_50,local_60[uVar11],(ulong)bVar8);
        if (iVar4 == 0) goto LAB_00195acc;
      }
      uVar11 = uVar11 + 1;
      if ((uVar9 & 0xffffffff) == uVar11) break;
    } while( true );
  }
  iVar4 = iVar3;
  if ((((ulong)pvVar1 & 2) != 0) && (0 < iVar3)) {
LAB_00195bce:
    uVar11 = 0;
    do {
      bVar8 = *(byte *)((long)puVar10 + uVar11);
      if ((int)(uint)bVar8 <= iVar4) {
        iVar3 = bcmp(local_50 + ((long)iVar4 - (ulong)bVar8),local_60[uVar11],(ulong)bVar8);
        if (iVar3 == 0) goto LAB_00195c15;
      }
      uVar11 = uVar11 + 1;
      if ((int)uVar9 + (uint)((int)uVar9 == 0) == uVar11) break;
    } while( true );
  }
LAB_00195c20:
  iVar3 = iVar4;
  if (argc != 1) {
    sqlite3_free(local_60);
  }
LAB_00195c3d:
  setResultStrOrError(context,local_50,iVar3,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  return;
LAB_00195acc:
  local_50 = local_50 + bVar8;
  iVar4 = iVar3 - (uint)bVar8;
  bVar2 = iVar3 < (int)(uint)bVar8;
  iVar3 = iVar4;
  if (iVar4 == 0 || bVar2) goto LAB_00195c20;
  goto LAB_00195a8c;
LAB_00195c15:
  iVar4 = (int)((long)iVar4 - (ulong)bVar8);
  if (iVar4 < 1) goto LAB_00195c20;
  goto LAB_00195bce;
}

Assistant:

static void trimFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *zIn;         /* Input string */
  const unsigned char *zCharSet;    /* Set of characters to trim */
  int nIn;                          /* Number of bytes in input */
  int flags;                        /* 1: trimleft  2: trimright  3: trim */
  int i;                            /* Loop counter */
  unsigned char *aLen = 0;          /* Length of each character in zCharSet */
  unsigned char **azChar = 0;       /* Individual characters in zCharSet */
  int nChar;                        /* Number of characters in zCharSet */

  if( sqlite3_value_type(argv[0])==SQLITE_NULL ){
    return;
  }
  zIn = sqlite3_value_text(argv[0]);
  if( zIn==0 ) return;
  nIn = sqlite3_value_bytes(argv[0]);
  assert( zIn==sqlite3_value_text(argv[0]) );
  if( argc==1 ){
    static const unsigned char lenOne[] = { 1 };
    static unsigned char * const azOne[] = { (u8*)" " };
    nChar = 1;
    aLen = (u8*)lenOne;
    azChar = (unsigned char **)azOne;
    zCharSet = 0;
  }else if( (zCharSet = sqlite3_value_text(argv[1]))==0 ){
    return;
  }else{
    const unsigned char *z;
    for(z=zCharSet, nChar=0; *z; nChar++){
      SQLITE_SKIP_UTF8(z);
    }
    if( nChar>0 ){
      azChar = contextMalloc(context, ((i64)nChar)*(sizeof(char*)+1));
      if( azChar==0 ){
        return;
      }
      aLen = (unsigned char*)&azChar[nChar];
      for(z=zCharSet, nChar=0; *z; nChar++){
        azChar[nChar] = (unsigned char *)z;
        SQLITE_SKIP_UTF8(z);
        aLen[nChar] = (u8)(z - azChar[nChar]);
      }
    }
  }
  if( nChar>0 ){
    flags = SQLITE_PTR_TO_INT(sqlite3_user_data(context));
    if( flags & 1 ){
      while( nIn>0 ){
        int len = 0;
        for(i=0; i<nChar; i++){
          len = aLen[i];
          if( len<=nIn && memcmp(zIn, azChar[i], len)==0 ) break;
        }
        if( i>=nChar ) break;
        zIn += len;
        nIn -= len;
      }
    }
    if( flags & 2 ){
      while( nIn>0 ){
        int len = 0;
        for(i=0; i<nChar; i++){
          len = aLen[i];
          if( len<=nIn && memcmp(&zIn[nIn-len],azChar[i],len)==0 ) break;
        }
        if( i>=nChar ) break;
        nIn -= len;
      }
    }
    if( zCharSet ){
      sqlite3_free(azChar);
    }
  }
  sqlite3_result_text(context, (char*)zIn, nIn, SQLITE_TRANSIENT);
}